

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBuiltin_db_fetch_next(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  char *pcVar2;
  unqlite_col *pCol;
  jx9_value *pValue;
  int iFlag;
  SyString *pFuncName;
  jx9_vm *pVm;
  jx9_value *pDest;
  int nByte;
  SyString sName;
  uint local_2c;
  SyString local_28;
  
  if (argc < 1) {
    pVm = pCtx->pVm;
    pFuncName = &pCtx->pFunc->sName;
    pcVar2 = "Missing collection name";
LAB_0011824b:
    jx9VmThrowError(pVm,pFuncName,1,pcVar2);
  }
  else {
    pcVar2 = jx9_value_to_string(*argv,(int *)&local_2c);
    if ((int)local_2c < 1) {
      pVm = pCtx->pVm;
      pFuncName = &pCtx->pFunc->sName;
      pcVar2 = "Invalid collection name";
      goto LAB_0011824b;
    }
    local_28.nByte = local_2c;
    local_28.zString = pcVar2;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_28,iFlag);
    if (pCol != (unqlite_col *)0x0) {
      pValue = jx9_context_new_scalar(pCtx);
      if (pValue != (jx9_value *)0x0) {
        iVar1 = unqliteCollectionFetchNextRecord(pCol,pValue);
        pDest = pCtx->pRet;
        if (iVar1 == 0) {
          jx9MemObjStore(pValue,pDest);
          return 0;
        }
        goto LAB_00118259;
      }
      pVm = pCtx->pVm;
      pFuncName = &pCtx->pFunc->sName;
      pcVar2 = "Jx9 is running out of memory";
      goto LAB_0011824b;
    }
  }
  pDest = pCtx->pRet;
LAB_00118259:
  jx9MemObjRelease(pDest);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_fetch_next(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		/* Fetch the current record */
		jx9_value *pValue;
		pValue = jx9_context_new_scalar(pCtx);
		if( pValue == 0 ){
			jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Jx9 is running out of memory");
			jx9_result_null(pCtx);
			return JX9_OK;
		}else{
			rc = unqliteCollectionFetchNextRecord(pCol,pValue);
			if( rc == UNQLITE_OK ){
				jx9_result_value(pCtx,pValue);
				/* pValue will be automatically released as soon we return from this function */
			}else{
				/* Return null */
				jx9_result_null(pCtx);
			}
		}
	}else{
		/* No such collection, return null */
		jx9_result_null(pCtx);
	}
	return JX9_OK;
}